

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_strcasecmp(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  do {
    iVar2 = lowercase(s1);
    iVar3 = lowercase(s2);
    if (iVar2 != iVar3) break;
    s2 = s2 + 1;
    cVar1 = *s1;
    s1 = s1 + 1;
    iVar3 = iVar2;
  } while (cVar1 != '\0');
  return iVar2 - iVar3;
}

Assistant:

static int mg_strcasecmp(const char *s1, const char *s2) {
  int diff;

  do {
    diff = lowercase(s1++) - lowercase(s2++);
  } while (diff == 0 && s1[-1] != '\0');

  return diff;
}